

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::writeXmodem(Samba *this,uint8_t *buffer,int size)

{
  int iVar1;
  pointer pSVar2;
  SambaError *pSVar3;
  int local_ec;
  int local_b0;
  int bytes;
  int retries;
  uint32_t blkNum;
  uint8_t blk [133];
  uint8_t *puStack_18;
  int size_local;
  uint8_t *buffer_local;
  Samba *this_local;
  
  bytes = 1;
  unique0x1000030c = size;
  for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    iVar1 = (*pSVar2->_vptr_SerialPort[7])();
    if (iVar1 == 0x43) break;
  }
  puStack_18 = buffer;
  if (local_b0 == 5) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  for (; 0 < stack0xffffffffffffffe4; register0x00000000 = stack0xffffffffffffffe4 + -0x80) {
    retries._0_1_ = 1;
    retries._1_1_ = (byte)bytes;
    retries._2_1_ = retries._1_1_ ^ 0xff;
    if (stack0xffffffffffffffe4 < 0x80) {
      local_ec = stack0xffffffffffffffe4;
    }
    else {
      local_ec = 0x80;
    }
    memmove((void *)((long)&retries + 3),puStack_18,(long)local_ec);
    if (stack0xffffffffffffffe4 < 0x80) {
      memset((void *)((long)&retries + (long)stack0xffffffffffffffe4 + 3),0,
             (long)(0x80 - stack0xffffffffffffffe4));
    }
    crc16Add(this,(uint8_t *)&retries);
    for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
      pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->
                         (&this->_port);
      iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,&retries,0x85);
      if (iVar1 != 0x85) {
        pSVar3 = (SambaError *)__cxa_allocate_exception(8);
        SambaError::SambaError(pSVar3);
        __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
      }
      pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->
                         (&this->_port);
      iVar1 = (*pSVar2->_vptr_SerialPort[7])();
      if (iVar1 == 6) break;
    }
    if (local_b0 == 5) {
      pSVar3 = (SambaError *)__cxa_allocate_exception(8);
      SambaError::SambaError(pSVar3);
      __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
    }
    puStack_18 = puStack_18 + 0x80;
    bytes = bytes + 1;
  }
  for (local_b0 = 0; local_b0 < 5; local_b0 = local_b0 + 1) {
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[8])(pSVar2,4);
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    iVar1 = (*pSVar2->_vptr_SerialPort[7])();
    if (iVar1 == 6) break;
  }
  if (local_b0 != 5) {
    return;
  }
  pSVar3 = (SambaError *)__cxa_allocate_exception(8);
  SambaError::SambaError(pSVar3);
  __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
}

Assistant:

void
Samba::writeXmodem(const uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == START)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();

    while (size > 0)
    {
        blk[0] = SOH;
        blk[1] = (blkNum & 0xff);
        blk[2] = ~(blkNum & 0xff);
        memmove(&blk[3], buffer, min(size, BLK_SIZE));
        if (size < BLK_SIZE)
            memset(&blk[3] + size, 0, BLK_SIZE - size);
        crc16Add(blk);

        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            bytes = _port->write(blk, sizeof(blk));
            if (bytes != sizeof(blk))
                throw SambaError();

            if (_port->get() == ACK)
                break;
        }

        if (retries == MAX_RETRIES)
            throw SambaError();

        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        _port->put(EOT);
        if (_port->get() == ACK)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}